

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allergen-assessment.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  char *__s;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  const_iterator cVar2;
  _Rb_tree_node_base *p_Var3;
  size_t sVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar7;
  int iVar8;
  unsigned_long uVar9;
  pointer puVar10;
  pointer puVar11;
  foods_t foods;
  string a2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> occurence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  allergen_food;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  safe;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allergens;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  foods_t local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_310;
  pointer local_2f8;
  pointer local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,2,argv
             );
    if (local_240._M_index == '\0') {
      pvVar7 = std::get<0ul,int,std::ifstream>
                         ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                          &local_240);
      iVar8 = *pvVar7;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           &local_240);
      tokenize_abi_cxx11_<std::ifstream>(&local_2e8,file_00);
      read_foods<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_348,&local_2e8);
      all_allergens_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_270,&local_348);
      safe_ingredients_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_2a0,&local_348);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_310,
                 ((long)local_348.
                        super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_348.
                        super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555,
                 (allocator_type *)&local_2d0);
      local_2f8 = local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      puVar11 = local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar10 = local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar9 = 0;
          p_Var3 = ((local_348.
                     super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl
                     .super__Vector_impl_data._M_start)->ingredients)._M_t._M_impl.
                   super__Rb_tree_header._M_header._M_left;
          local_2f0 = local_348.
                      super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          puVar11 = local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          while (local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start = puVar11,
                (_Rb_tree_header *)p_Var3 !=
                &((local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>
                   ._M_impl.super__Vector_impl_data._M_start)->ingredients)._M_t._M_impl.
                 super__Rb_tree_header) {
            cVar2 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&local_2a0,(key_type *)(p_Var3 + 1));
            uVar9 = uVar9 + ((_Rb_tree_header *)cVar2._M_node !=
                            &local_2a0._M_impl.super__Rb_tree_header);
            p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
            puVar11 = local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          }
          *puVar10 = uVar9;
          local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
          super__Vector_impl_data._M_start = local_2f0 + 1;
          puVar10 = puVar10 + 1;
        } while (local_348.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                 _M_impl.super__Vector_impl_data._M_start != local_2f8);
      }
      for (; puVar11 !=
             local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish; puVar11 = puVar11 + 1) {
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      local_330._M_string_length = 0;
      local_330.field_2._M_local_buf[0] = '\0';
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      solve_allergens_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_2d0,&local_348);
      p_Var1 = &local_2d0._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_2d0._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
        p_Var6 = local_2d0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_330,*(char **)(p_Var6 + 2),(size_type)p_Var6[2]._M_parent);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (&local_330,',');
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
        } while ((_Rb_tree_header *)p_Var6 != p_Var1);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_330);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_330._M_dataplus._M_p,
                          local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_330._M_dataplus._M_p,local_330._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,
                        CONCAT71(local_330.field_2._M_allocated_capacity._1_7_,
                                 local_330.field_2._M_local_buf[0]) + 1);
      }
      if (local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_310.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_310.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_310.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_2a0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_270);
      std::vector<ingredientlist_t,_std::allocator<ingredientlist_t>_>::~vector(&local_348);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e8);
      iVar8 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage(&local_240);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b100);
    }
    else {
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {path-to-file}",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto foods = read_foods(tokens);
  auto allergens = all_allergens(foods);
  auto safe = safe_ingredients(foods);

  // Part 1: count occurence of safe ingredients in all food
  auto occurence = std::vector<size_t> (foods.size());
  ranges::transform(foods, occurence.begin(), [&safe](const auto& food){
    return ranges::count_if(food.ingredients, [&safe](const auto& ingredient){
      return safe.contains(ingredient);
    });
  });
  auto a1 = std::accumulate(occurence.cbegin(), occurence.cend(), size_t{0});
  std::cout << "Part 1: " << a1 << "\n";

  // Part 2: solve the allergen-ingredient map
  std::string a2;
  auto allergen_food = solve_allergens(foods);
  ranges::for_each(allergen_food, [&](const auto& af){
    a2.append(af.second);
    a2.push_back(',');
  });
  a2.pop_back();
  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << "\n";
}